

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSiteNameCommand.cxx
# Opt level: O3

bool __thiscall
cmSiteNameCommand::InitialPass
          (cmSiteNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string host;
  string siteName;
  RegularExpression hostReg;
  string hostRegExp;
  string hostname_cmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  string local_1a0;
  long *local_180 [2];
  long local_170 [2];
  undefined1 local_160 [88];
  char *local_108;
  char *local_a8;
  long *local_90 [2];
  long local_80 [2];
  char *local_70;
  undefined8 local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  lVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = local_160 + 0x10;
  local_160._0_8_ = pcVar1;
  if (lVar4 == 0x20) {
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"/usr/bsd","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    local_160._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"/usr/sbin","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    local_160._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"/usr/bin","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    local_160._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"/bin","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    local_160._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"/sbin","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    local_160._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"/usr/local/bin","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    pcVar3 = cmMakefile::GetDefinition
                       ((this->super_cmCommand).Makefile,
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    if (pcVar3 == (char *)0x0) {
      this_00 = (this->super_cmCommand).Makefile;
      local_160._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"HOSTNAME","");
      pcVar3 = cmMakefile::GetDefinition(this_00,(string *)local_160);
      if ((pointer)local_160._0_8_ != pcVar1) {
        operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
      }
      local_68 = 0;
      local_60 = '\0';
      local_70 = &local_60;
      if (pcVar3 == (char *)0x0) {
        cmsys::SystemTools::FindProgram((string *)local_160,"hostname",&local_1b8,false);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_160);
        if ((pointer)local_160._0_8_ != pcVar1) {
          operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
        }
      }
      else {
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar3);
      }
      local_180[0] = local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"unknown","");
      bVar2 = cmSystemTools::IsOff(local_70);
      if (!bVar2) {
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        local_1a0._M_string_length = 0;
        local_1a0.field_2._M_local_buf[0] = '\0';
        cmSystemTools::RunSingleCommand
                  (local_70,&local_1a0,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_NONE,0.0);
        if (local_1a0._M_string_length != 0) {
          local_90[0] = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*","");
          local_a8 = (char *)0x0;
          if (local_90[0] != (long *)0x0) {
            cmsys::RegularExpression::compile((RegularExpression *)local_160,(char *)local_90[0]);
          }
          bVar2 = cmsys::RegularExpression::find
                            ((RegularExpression *)local_160,local_1a0._M_dataplus._M_p);
          if (bVar2) {
            local_50 = &local_40;
            if ((char *)local_160._8_8_ == (char *)0x0) {
              local_48 = 0;
              local_40 = 0;
            }
            else {
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,local_160._8_8_,local_108);
            }
            std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_50);
            if (local_50 != &local_40) {
              operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
            }
          }
          if (local_1a0._M_string_length != 0) {
            std::__cxx11::string::_M_assign((string *)local_180);
          }
          if (local_a8 != (char *)0x0) {
            operator_delete__(local_a8);
          }
          if (local_90[0] != local_80) {
            operator_delete(local_90[0],local_80[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,
                          CONCAT71(local_1a0.field_2._M_allocated_capacity._1_7_,
                                   local_1a0.field_2._M_local_buf[0]) + 1);
        }
      }
      cmMakefile::AddCacheDefinition
                ((this->super_cmCommand).Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,(char *)local_180[0],
                 "Name of the computer/site where compile is being run",STRING,false);
      if (local_180[0] != local_170) {
        operator_delete(local_180[0],local_170[0] + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b8);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_160,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_160);
    if ((pointer)local_160._0_8_ != pcVar1) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
  }
  return lVar4 == 0x20;
}

Assistant:

bool cmSiteNameCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() != 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector<std::string> paths;
  paths.push_back("/usr/bsd");
  paths.push_back("/usr/sbin");
  paths.push_back("/usr/bin");
  paths.push_back("/bin");
  paths.push_back("/sbin");
  paths.push_back("/usr/local/bin");

  const char* cacheValue
    = this->Makefile->GetDefinition(args[0]);
  if(cacheValue)
    {
    return true;
    }

  const char *temp = this->Makefile->GetDefinition("HOSTNAME");
  std::string hostname_cmd;
  if(temp)
    {
    hostname_cmd = temp;
    }
  else
    {
    hostname_cmd = cmSystemTools::FindProgram("hostname", paths);
    }

  std::string siteName = "unknown";
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string host;
  if(cmSystemTools::ReadRegistryValue
     ("HKEY_LOCAL_MACHINE\\System\\CurrentControlSet\\"
      "Control\\ComputerName\\ComputerName;ComputerName", host))
    {
    siteName = host;
    }
#else
  // try to find the hostname for this computer
  if (!cmSystemTools::IsOff(hostname_cmd.c_str()))
    {
    std::string host;
    cmSystemTools::RunSingleCommand(hostname_cmd.c_str(),
      &host, 0, 0, 0, cmSystemTools::OUTPUT_NONE);

    // got the hostname
    if (!host.empty())
      {
      // remove any white space from the host name
      std::string hostRegExp = "[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*";
      cmsys::RegularExpression hostReg (hostRegExp.c_str());
      if (hostReg.find(host.c_str()))
        {
        // strip whitespace
        host = hostReg.match(1);
        }

      if(!host.empty())
        {
        siteName = host;
        }
      }
    }
#endif
  this->Makefile->
    AddCacheDefinition(args[0],
                       siteName.c_str(),
                       "Name of the computer/site where compile is being run",
                       cmState::STRING);

  return true;
}